

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

Proto * addprototype(LexState *ls)

{
  int iVar1;
  lua_State *L_00;
  FuncState *pFVar2;
  Proto *o;
  Proto **ppPVar3;
  Proto *v;
  int local_34;
  int oldsize;
  Proto *f;
  FuncState *fs;
  lua_State *L;
  Proto *clp;
  LexState *ls_local;
  
  L_00 = ls->L;
  pFVar2 = ls->fs;
  o = pFVar2->f;
  if (o->sizep <= pFVar2->np) {
    local_34 = o->sizep;
    ppPVar3 = (Proto **)luaM_growaux_(L_00,o->p,pFVar2->np,&o->sizep,8,0x1ffff,"functions");
    o->p = ppPVar3;
    while (local_34 < o->sizep) {
      o->p[local_34] = (Proto *)0x0;
      local_34 = local_34 + 1;
    }
  }
  v = luaF_newproto(L_00);
  ppPVar3 = o->p;
  iVar1 = pFVar2->np;
  pFVar2->np = iVar1 + 1;
  ppPVar3[iVar1] = v;
  if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    luaC_barrier_(L_00,(GCObject *)o,(GCObject *)v);
  }
  return v;
}

Assistant:

static Proto *addprototype (LexState *ls) {
  Proto *clp;
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;  /* prototype of current function */
  if (fs->np >= f->sizep) {
    int oldsize = f->sizep;
    luaM_growvector(L, f->p, fs->np, f->sizep, Proto *, MAXARG_Bx, "functions");
    while (oldsize < f->sizep)
      f->p[oldsize++] = NULL;
  }
  f->p[fs->np++] = clp = luaF_newproto(L);
  luaC_objbarrier(L, f, clp);
  return clp;
}